

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write.c
# Opt level: O0

archive_write_filter * filter_lookup(archive *_a,int n)

{
  archive *local_30;
  archive_write_filter *f;
  archive_write *a;
  int n_local;
  archive *_a_local;
  
  local_30 = (archive *)_a[1].error_string.buffer_length;
  if (n == -1) {
    _a_local = (archive *)_a[1].current_code;
  }
  else {
    a._4_4_ = n;
    if (n < 0) {
      _a_local = (archive *)0x0;
    }
    else {
      for (; 0 < a._4_4_ && local_30 != (archive *)0x0; a._4_4_ = a._4_4_ + -1) {
        local_30 = *(archive **)&local_30->archive_format;
      }
      _a_local = local_30;
    }
  }
  return (archive_write_filter *)_a_local;
}

Assistant:

static struct archive_write_filter *
filter_lookup(struct archive *_a, int n)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct archive_write_filter *f = a->filter_first;
	if (n == -1)
		return a->filter_last;
	if (n < 0)
		return NULL;
	while (n > 0 && f != NULL) {
		f = f->next_filter;
		--n;
	}
	return f;
}